

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O1

void __thiscall
SparseArray_SizeBytesAgree_Test<unsigned_short>::TestBody
          (SparseArray_SizeBytesAgree_Test<unsigned_short> *this)

{
  short sVar1;
  pointer *__ptr;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  ushort *local_40;
  Message local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  unsigned_long local_10;
  
  pstore::sparse_array<unsigned_int,unsigned_short>::
  make_unique<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
            ((pair<unsigned_int,_unsigned_int> *)&local_58,
             (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
              )0x0);
  sVar1 = (short)POPCOUNT((uint)(ushort)(short)(local_58.data_)->type);
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)(ushort)((sVar1 + (ushort)(sVar1 == 0)) * 4 + 4);
  local_40 = (ushort *)0x8;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_38,
             "(sparse_array<unsigned, TypeParam>::make_unique (std::begin (empty), std::end (empty)) ->size_bytes ())"
             ,"(sparse_array<unsigned, TypeParam>::size_bytes (0))",(unsigned_long *)&local_50,
             (unsigned_long *)&local_40);
  if (local_58.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_58.data_);
  }
  if (local_38.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (pbStack_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x125,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (pbStack_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_30,pbStack_30);
  }
  local_40 = (ushort *)0x0;
  pstore::sparse_array<unsigned_int,unsigned_short>::
  make_unique<unsigned_long_const*,unsigned_int_const*>
            ((sparse_array<unsigned_int,unsigned_short> *)&local_58,(unsigned_long *)&local_40,
             (unsigned_long *)&local_38,(uint *)0x0,(uint *)0x0);
  sVar1 = (short)POPCOUNT((uint)(ushort)(short)(local_58.data_)->type);
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)(ushort)((sVar1 + (ushort)(sVar1 == 0)) * 4 + 4);
  local_10 = 8;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_38,
             "(sparse_array<unsigned, TypeParam>::make_unique ({0})->size_bytes ())",
             "(sparse_array<unsigned, TypeParam>::size_bytes (1))",(unsigned_long *)&local_50,
             &local_10);
  if (local_58.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_58.data_);
  }
  if (local_38.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (pbStack_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (pbStack_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_30,pbStack_30);
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  pstore::sparse_array<unsigned_int,unsigned_short>::
  make_unique<unsigned_long_const*,unsigned_int_const*>
            ((sparse_array<unsigned_int,unsigned_short> *)&local_40,(unsigned_long *)&local_50,
             (unsigned_long *)&local_40,(uint *)0x0,(uint *)0x0);
  local_58.data_ =
       (AssertHelperData *)
       (ulong)(ushort)(((short)POPCOUNT((uint)*local_40) +
                       (ushort)((short)POPCOUNT((uint)*local_40) == 0)) * 4 + 4);
  local_10 = 0xc;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_38,
             "(sparse_array<unsigned, TypeParam>::make_unique ({1, 3})->size_bytes ())",
             "(sparse_array<unsigned, TypeParam>::size_bytes (2))",(unsigned_long *)&local_58,
             &local_10);
  if (local_40 != (ushort *)0x0) {
    operator_delete(local_40);
  }
  if (local_38.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (pbStack_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x12a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (pbStack_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_30,pbStack_30);
  }
  local_28 = 5;
  uStack_20 = 7;
  local_38.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x1;
  pbStack_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_18 = 0xb;
  pstore::sparse_array<unsigned_int,unsigned_short>::
  make_unique<unsigned_long_const*,unsigned_int_const*>
            ((sparse_array<unsigned_int,unsigned_short> *)&local_40,(unsigned_long *)&local_38,
             &local_10,(uint *)0x0,(uint *)0x0);
  local_58.data_ =
       (AssertHelperData *)
       (ulong)(ushort)(((short)POPCOUNT((uint)*local_40) +
                       (ushort)((short)POPCOUNT((uint)*local_40) == 0)) * 4 + 4);
  local_10 = 0x18;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_50,
             "(sparse_array<unsigned, TypeParam>::make_unique ({1, 3, 5, 7, 11})->size_bytes ())",
             "(sparse_array<unsigned, TypeParam>::size_bytes (5))",(unsigned_long *)&local_58,
             &local_10);
  if (local_40 != (ushort *)0x0) {
    operator_delete(local_40);
  }
  if (local_50._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,300,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_38.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_38.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TYPED_TEST (SparseArray, SizeBytesAgree) {
    std::vector<std::pair<unsigned, unsigned>> empty;
    EXPECT_EQ (
        (sparse_array<unsigned, TypeParam>::make_unique (std::begin (empty), std::end (empty))
             ->size_bytes ()),
        (sparse_array<unsigned, TypeParam>::size_bytes (0)));

    EXPECT_EQ ((sparse_array<unsigned, TypeParam>::make_unique ({0})->size_bytes ()),
               (sparse_array<unsigned, TypeParam>::size_bytes (1)));
    EXPECT_EQ ((sparse_array<unsigned, TypeParam>::make_unique ({1, 3})->size_bytes ()),
               (sparse_array<unsigned, TypeParam>::size_bytes (2)));
    EXPECT_EQ ((sparse_array<unsigned, TypeParam>::make_unique ({1, 3, 5, 7, 11})->size_bytes ()),
               (sparse_array<unsigned, TypeParam>::size_bytes (5)));
}